

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  uint16_t *in_RCX;
  uint16_t *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wb_00;
  int i;
  __m128i row;
  uint32_t sum32;
  __m128i sum;
  __m128i sum_left;
  __m128i sum_above;
  undefined4 local_13c;
  undefined2 local_11c;
  undefined8 local_c0;
  
  dc_sum_4(in_RDX);
  dc_sum_8(in_RCX);
  local_11c = (undefined2)(((ushort)(extraout_XMM0_Wb + extraout_XMM0_Wb_00) + 6) / 0xc);
  uVar1 = CONCAT26(local_11c,CONCAT24(local_11c,CONCAT22(local_11c,local_11c)));
  local_c0 = in_RDI;
  for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
    *local_c0 = uVar1;
    local_c0 = (undefined8 *)((long)local_c0 + in_RSI * 2);
    *local_c0 = uVar1;
    local_c0 = (undefined8 *)(in_RSI * 2 + (long)local_c0);
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)bd;
  const __m128i sum_above = dc_sum_4(above);
  const __m128i sum_left = dc_sum_8(left);
  const __m128i sum = _mm_add_epi16(sum_above, sum_left);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 >>= 16;
  sum32 += 6;
  sum32 /= 12;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_storel_epi64((__m128i *)dst, row);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row);
    dst += stride;
  }
}